

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiContextHook *pIVar3;
  ImGuiViewportP *pIVar4;
  ImGuiWindow *window;
  ImVec2 cr_max;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  int iVar14;
  ImU32 IVar15;
  uint uVar16;
  int iVar17;
  ImDrawList *pIVar18;
  ImGuiWindow *pIVar19;
  char cVar20;
  int iVar21;
  ImDrawList **ppIVar22;
  ImGuiContext *g;
  bool bVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ImGuiWindow *pIVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImVec4 local_48;
  
  pIVar11 = GImGui;
  iVar17 = GImGui->FrameCountEnded;
  if (iVar17 != GImGui->FrameCount) {
    EndFrame();
    iVar17 = pIVar11->FrameCount;
  }
  iVar21 = pIVar11->FrameCountRendered;
  pIVar11->FrameCountRendered = iVar17;
  (pIVar11->IO).MetricsRenderWindows = 0;
  iVar14 = (pIVar11->Hooks).Size;
  if (0 < iVar14) {
    lVar25 = 0;
    lVar26 = 0;
    do {
      pIVar3 = (pIVar11->Hooks).Data;
      if (*(int *)(pIVar3 + lVar25 + 4) == 4) {
        (**(code **)(pIVar3 + lVar25 + 0x10))(pIVar11);
        iVar14 = (pIVar11->Hooks).Size;
      }
      lVar26 = lVar26 + 1;
      lVar25 = lVar25 + 0x20;
    } while (lVar26 < iVar14);
  }
  if ((pIVar11->Viewports).Size != 0) {
    uVar24 = 0;
    do {
      pIVar4 = (pIVar11->Viewports).Data[uVar24];
      ImDrawDataBuilder::Clear(&pIVar4->DrawDataBuilder);
      if (pIVar4->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar18 = GetViewportDrawList(pIVar4,0,"##Background");
        AddDrawListToDrawData((pIVar4->DrawDataBuilder).Layers,pIVar18);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != (uint)(pIVar11->Viewports).Size);
  }
  pIVar12 = GImGui;
  if (iVar21 != iVar17) {
    pIVar19 = GetTopMostAndVisiblePopupModal();
    fVar30 = pIVar12->DimBgRatio;
    if ((0.0 < fVar30) || (0.0 < pIVar12->NavWindowingHighlightAlpha)) {
      pIVar27 = pIVar12->NavWindowingTargetAnim;
      if (pIVar27 == (ImGuiWindow *)0x0) {
        cVar20 = '\0';
      }
      else {
        cVar20 = pIVar27->Active;
      }
      if ((pIVar19 != (ImGuiWindow *)0x0) || (cVar20 != '\0')) {
        if (pIVar19 == (ImGuiWindow *)0x0) {
          if (cVar20 != '\0') {
            local_48.x = (pIVar12->Style).Colors[0x33].x;
            local_48.y = (pIVar12->Style).Colors[0x33].y;
            uVar7 = (pIVar12->Style).Colors[0x33].z;
            uVar8 = (pIVar12->Style).Colors[0x33].w;
            local_48.w = fVar30 * (pIVar12->Style).Alpha * (float)uVar8;
            local_48.z = (float)uVar7;
            IVar15 = ColorConvertFloat4ToU32(&local_48);
            RenderDimmedBackgroundBehindWindow(pIVar27,IVar15);
            pIVar19 = pIVar12->NavWindowingTargetAnim;
            pIVar4 = *(GImGui->Viewports).Data;
            fVar30 = pIVar12->FontSize;
            fVar28 = (pIVar19->Pos).x;
            fVar29 = (pIVar19->Pos).y;
            local_58.x = fVar28 - fVar30;
            local_58.y = fVar29 - fVar30;
            IStack_50.x = fVar30 + (pIVar19->Size).x + fVar28;
            IStack_50.y = fVar30 + (pIVar19->Size).y + fVar29;
            fVar28 = (pIVar4->super_ImGuiViewport).Size.x;
            if ((fVar28 <= IStack_50.x - local_58.x) &&
               ((pIVar4->super_ImGuiViewport).Size.y <= IStack_50.y - local_58.y)) {
              fVar30 = -1.0 - fVar30;
              local_58.x = local_58.x - fVar30;
              local_58.y = local_58.y - fVar30;
              IStack_50.x = fVar30 + IStack_50.x;
              IStack_50.y = fVar30 + IStack_50.y;
            }
            pIVar18 = pIVar19->DrawList;
            if ((pIVar18->CmdBuffer).Size == 0) {
              ImDrawList::AddDrawCmd(pIVar18);
              pIVar18 = pIVar19->DrawList;
              fVar28 = (pIVar4->super_ImGuiViewport).Size.x;
            }
            IVar2 = (pIVar4->super_ImGuiViewport).Pos;
            cr_max.y = (pIVar4->super_ImGuiViewport).Size.y + IVar2.y;
            cr_max.x = fVar28 + IVar2.x;
            ImDrawList::PushClipRect(pIVar18,IVar2,cr_max,false);
            pIVar18 = pIVar19->DrawList;
            local_48.x = (GImGui->Style).Colors[0x32].x;
            local_48.y = (GImGui->Style).Colors[0x32].y;
            uVar9 = (GImGui->Style).Colors[0x32].z;
            uVar10 = (GImGui->Style).Colors[0x32].w;
            local_48.w = pIVar12->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar10
            ;
            local_48.z = (float)uVar9;
            IVar15 = ColorConvertFloat4ToU32(&local_48);
            ImDrawList::AddRect(pIVar18,&local_58,&IStack_50,IVar15,pIVar19->WindowRounding,0,3.0);
            ImDrawList::PopClipRect(pIVar19->DrawList);
          }
        }
        else {
          pIVar19 = FindBottomMostVisibleWindowWithinBeginStack(pIVar19);
          local_48.x = (pIVar12->Style).Colors[0x34].x;
          local_48.y = (pIVar12->Style).Colors[0x34].y;
          uVar5 = (pIVar12->Style).Colors[0x34].z;
          uVar6 = (pIVar12->Style).Colors[0x34].w;
          local_48.w = fVar30 * (pIVar12->Style).Alpha * (float)uVar6;
          local_48.z = (float)uVar5;
          IVar15 = ColorConvertFloat4ToU32(&local_48);
          RenderDimmedBackgroundBehindWindow(pIVar19,IVar15);
        }
      }
    }
  }
  pIVar19 = pIVar11->NavWindowingTarget;
  if (pIVar19 == (ImGuiWindow *)0x0) {
    pIVar19 = (ImGuiWindow *)0x0;
    pIVar27 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar19->Flags & 0x2000) == 0) {
      pIVar19 = pIVar19->RootWindow;
    }
    else {
      pIVar19 = (ImGuiWindow *)0x0;
    }
    pIVar27 = pIVar11->NavWindowingListWindow;
  }
  uVar16 = (pIVar11->Windows).Size;
  if (uVar16 != 0) {
    uVar24 = 0;
    do {
      window = (pIVar11->Windows).Data[uVar24];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar27 && window != pIVar19) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        uVar16 = (pIVar11->Windows).Size;
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar16);
  }
  bVar13 = true;
  do {
    bVar23 = bVar13;
    if (((pIVar19 != (ImGuiWindow *)0x0) && (pIVar19->Active == true)) && (pIVar19->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar19,(uint)pIVar19->Flags >> 0x19 & 1);
    }
    pIVar19 = pIVar27;
    bVar13 = false;
  } while (bVar23);
  if ((((pIVar11->IO).MouseDrawCursor & iVar21 != iVar17) != 0) && (pIVar11->MouseCursor != -1)) {
    RenderMouseCursor((pIVar11->IO).MousePos,(pIVar11->Style).MouseCursorScale,pIVar11->MouseCursor,
                      0xffffffff,0xff000000,0x30000000);
  }
  (pIVar11->IO).MetricsRenderVertices = 0;
  (pIVar11->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar11->Viewports).Size) {
    lVar25 = 0;
    do {
      pIVar4 = (pIVar11->Viewports).Data[lVar25];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar4->DrawDataBuilder);
      if (pIVar4->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar18 = GetViewportDrawList(pIVar4,1,"##Foreground");
        AddDrawListToDrawData((pIVar4->DrawDataBuilder).Layers,pIVar18);
      }
      pIVar12 = GImGui;
      (pIVar4->DrawDataP).Valid = true;
      iVar17 = (pIVar4->DrawDataBuilder).Layers[0].Size;
      if (iVar17 < 1) {
        ppIVar22 = (ImDrawList **)0x0;
      }
      else {
        ppIVar22 = (pIVar4->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar4->DrawDataP).CmdLists = ppIVar22;
      (pIVar4->DrawDataP).CmdListsCount = iVar17;
      (pIVar4->DrawDataP).TotalIdxCount = 0;
      (pIVar4->DrawDataP).TotalVtxCount = 0;
      IVar2 = (pIVar4->super_ImGuiViewport).Size;
      (pIVar4->DrawDataP).DisplayPos = (pIVar4->super_ImGuiViewport).Pos;
      (pIVar4->DrawDataP).DisplaySize = IVar2;
      (pIVar4->DrawDataP).FramebufferScale = (pIVar12->IO).DisplayFramebufferScale;
      if (iVar17 < 1) {
        iVar17 = 0;
        iVar21 = 0;
      }
      else {
        lVar26 = 0;
        do {
          pIVar18 = (pIVar4->DrawDataBuilder).Layers[0].Data[lVar26];
          ImDrawList::_PopUnusedDrawCmd(pIVar18);
          iVar21 = (pIVar4->DrawDataP).TotalVtxCount + (pIVar18->VtxBuffer).Size;
          (pIVar4->DrawDataP).TotalVtxCount = iVar21;
          iVar17 = (pIVar4->DrawDataP).TotalIdxCount + (pIVar18->IdxBuffer).Size;
          (pIVar4->DrawDataP).TotalIdxCount = iVar17;
          lVar26 = lVar26 + 1;
        } while (lVar26 < (pIVar4->DrawDataBuilder).Layers[0].Size);
      }
      piVar1 = &(pIVar11->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + iVar21;
      piVar1 = &(pIVar11->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + iVar17;
      lVar25 = lVar25 + 1;
    } while (lVar25 < (pIVar11->Viewports).Size);
  }
  iVar17 = (pIVar11->Hooks).Size;
  if (0 < iVar17) {
    lVar25 = 0;
    lVar26 = 0;
    do {
      pIVar3 = (pIVar11->Hooks).Data;
      if (*(int *)(pIVar3 + lVar25 + 4) == 5) {
        (**(code **)(pIVar3 + lVar25 + 0x10))(pIVar11,pIVar3 + lVar25);
        iVar17 = (pIVar11->Hooks).Size;
      }
      lVar26 = lVar26 + 1;
      lVar25 = lVar25 + 0x20;
    } while (lVar26 < iVar17);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}